

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpProgramSPIRV
          (CLIntercept *this,cl_program program,uint64_t hash,bool modified,size_t length,void *il)

{
  uint uVar1;
  mapped_type *pmVar2;
  float __x;
  double __x_00;
  string fileName;
  char numberString [256];
  string local_1e8;
  pthread_mutex_t *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  cl_program local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  local_1c8 = (pthread_mutex_t *)&this->m_Mutex;
  local_1a0 = program;
  std::mutex::lock((mutex *)&local_1c8->__data);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_1c0);
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,local_138,&local_1e8);
  std::__cxx11::string::~string((string *)local_138);
  if (modified) {
    std::__cxx11::string::append((char *)&local_1e8);
  }
  memset(local_138,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    snprintf((char *)local_138,0x100,"%08X_0000",hash & 0xffffffff);
  }
  else {
    snprintf((char *)local_138,0x100,"%04u_%08X_0000",(ulong)this->m_ProgramNumber,hash & 0xffffffff
            );
  }
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&local_1e8);
  std::operator+(&local_1c0,"Dumping program to file (inject): ",&local_1e8);
  std::operator+(local_138,&local_1c0,"\n");
  log(this,__x_00);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_1c0);
  dumpMemoryToFile(this,&local_1e8,false,il,length);
  if ((this->m_Config).SPIRVDis._M_string_length != 0) {
    std::operator+(&local_198,&(this->m_Config).SPIRVDis," -o ");
    std::operator+(&local_178,&local_198,&local_1e8);
    std::operator+(&local_158,&local_178,"asm");
    std::operator+(&local_1c0,&local_158," ");
    std::operator+(local_138,&local_1c0,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    __x = (float)std::__cxx11::string::~string((string *)&local_198);
    logf(this,__x);
    system(local_138[0]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_138);
  }
  pmVar2 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&local_1a0);
  uVar1 = this->m_ProgramNumber;
  pmVar2->ProgramNumber = uVar1;
  pmVar2->CompileCount = 0;
  this->m_ProgramNumber = uVar1 + 1;
  std::__cxx11::string::~string((string *)&local_1e8);
  pthread_mutex_unlock(local_1c8);
  return;
}

Assistant:

void CLIntercept::dumpProgramSPIRV(
    cl_program program,
    uint64_t hash,
    bool modified,
    const size_t length,
    const void* il )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().DumpProgramSPIRV );

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    if( modified )
    {
        fileName += "/Modified";
    }

    // Make the file name.  It will have the form:
    //   CLI_<program number>_<hash>_0000.spv
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_0000",
                (unsigned int)hash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_0000",
                m_ProgramNumber,
                (unsigned int)hash );
        }

        fileName += "/CLI_";
        fileName += numberString;
        fileName += ".spv";
    }

    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    // Dump the program source to a .spv file.
    {
        log( "Dumping program to file (inject): " + fileName + "\n" );
        dumpMemoryToFile(
            fileName,
            false,
            il,
            length );

        // Optionally, run spirv-dis to disassemble the dumped file.
        if( !config().SPIRVDis.empty() )
        {
            std::string command =
                config().SPIRVDis +
                " -o " + fileName + "asm" +
                " " + fileName;

            logf( "Running: %s\n", command.c_str() );
            OS().ExecuteCommand( command );
        }
    }

    SProgramInfo&   programInfo = m_ProgramInfoMap[ program ];
    programInfo.ProgramNumber = m_ProgramNumber;
    programInfo.CompileCount = 0;

    m_ProgramNumber++;
}